

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

LR des_IP(LR lr)

{
  LR LVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar2 = ((uint)((ulong)lr >> 4) & 0xfffffff ^ lr.R) & 0xf0f0f0f;
  uVar3 = uVar2 << 4 ^ lr.L;
  uVar2 = uVar2 ^ lr.R;
  uVar4 = uVar2 & 0xffff ^ uVar3 >> 0x10;
  uVar3 = uVar4 << 0x10 ^ uVar3;
  uVar4 = uVar4 ^ uVar2;
  uVar2 = (uVar4 >> 2 ^ uVar3) & 0x33333333;
  uVar4 = uVar2 * 4 ^ uVar4;
  uVar2 = uVar2 ^ uVar3;
  uVar3 = (uVar4 >> 8 ^ uVar2) & 0xff00ff;
  uVar4 = uVar3 << 8 ^ uVar4;
  uVar3 = uVar3 ^ uVar2;
  uVar2 = (uVar3 >> 1 ^ uVar4) & 0x55555555;
  uVar3 = uVar2 * 2 ^ uVar3;
  uVar2 = uVar2 ^ uVar4;
  LVar1.L = uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f;
  LVar1.R = uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f;
  return LVar1;
}

Assistant:

static inline LR des_IP(LR lr)
{
    des_bitswap_IP_FP(&lr.R, &lr.L,  4, 0x0F0F0F0F);
    des_bitswap_IP_FP(&lr.R, &lr.L, 16, 0x0000FFFF);
    des_bitswap_IP_FP(&lr.L, &lr.R,  2, 0x33333333);
    des_bitswap_IP_FP(&lr.L, &lr.R,  8, 0x00FF00FF);
    des_bitswap_IP_FP(&lr.R, &lr.L,  1, 0x55555555);

    lr.L = ror(lr.L, 1);
    lr.R = ror(lr.R, 1);

    return lr;
}